

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<slang::ast::NetAlias>::reallocateTo
          (SmallVectorBase<slang::ast::NetAlias> *this,size_type newCapacity)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer p;
  size_type sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer pNVar7;
  long lVar8;
  
  pNVar7 = (pointer)operator_new(newCapacity << 5);
  p = this->data_;
  sVar3 = this->len;
  if (sVar3 != 0) {
    lVar8 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(p->sym).ptr + lVar8);
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(p->bounds).first + lVar8);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pNVar7->bounds).first + lVar8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      puVar1 = (undefined8 *)((long)&(pNVar7->sym).ptr + lVar8);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      lVar8 = lVar8 + 0x20;
    } while (sVar3 << 5 != lVar8);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->cap = newCapacity;
  this->data_ = pNVar7;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }